

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::DitheringCase::drawAndCheckUnicoloredQuad
          (DitheringCase *this,Vec4 *quadColor)

{
  ostringstream *poVar1;
  RGBA c;
  RGBA c_00;
  RenderContext *context;
  bool bVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int line;
  Surface *pSVar7;
  long lVar8;
  void *__buf;
  void *__buf_00;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  allocator<char> local_34a;
  allocator<char> local_349;
  TextureFormat local_348;
  Vec4 *local_340;
  Surface renderedImg;
  Surface errorMask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  string local_280;
  Random rnd;
  undefined1 local_250 [384];
  Quad quad;
  
  local_348 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_340 = quadColor;
  dVar3 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar9 = *(int *)CONCAT44(extraout_var,iVar4);
  if (0x1f < *(int *)CONCAT44(extraout_var,iVar4)) {
    iVar9 = 0x20;
  }
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 4);
  iVar12 = 0x20;
  if (iVar4 < 0x20) {
    iVar12 = iVar4;
  }
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,*(int *)CONCAT44(extraout_var_01,iVar4) - iVar9)
  ;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,
                             *(int *)(CONCAT44(extraout_var_02,iVar5) + 4) - iVar12);
  deqp::gls::FragmentOpUtil::Quad::Quad(&quad);
  tcu::Surface::Surface(&renderedImg,iVar9,iVar12);
  glwViewport(iVar4,iVar5,iVar9,iVar12);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,0x172);
  poVar1 = (ostringstream *)(local_250 + 8);
  local_250._0_4_ = local_348.order;
  local_250._4_4_ = local_348.type;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Dithering is ");
  pcVar10 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if (this->m_ditheringEnabled != false) {
    pcVar10 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::operator<<((ostream *)poVar1,pcVar10 + 0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_250,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (this->m_ditheringEnabled == true) {
    glwEnable(0xbd0);
    dVar3 = glwGetError();
    line = 0x177;
    pcVar10 = "glEnable(GL_DITHER)";
  }
  else {
    glwDisable(0xbd0);
    dVar3 = glwGetError();
    line = 0x179;
    pcVar10 = "glDisable(GL_DITHER)";
  }
  glu::checkError(dVar3,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,line);
  poVar1 = (ostringstream *)(local_250 + 8);
  local_250._0_4_ = local_348.order;
  local_250._4_4_ = local_348.type;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Drawing an unicolored quad with color ");
  tcu::operator<<((ostream *)poVar1,local_340);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_250,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  quad.color[0].m_data._0_8_ = *(undefined8 *)local_340->m_data;
  quad.color[0].m_data._8_8_ = *(undefined8 *)(local_340->m_data + 2);
  quad.color[1].m_data._0_8_ = *(undefined8 *)local_340->m_data;
  quad.color[1].m_data._8_8_ = *(undefined8 *)(local_340->m_data + 2);
  quad.color[2].m_data._0_8_ = *(undefined8 *)local_340->m_data;
  quad.color[2].m_data._8_8_ = *(undefined8 *)(local_340->m_data + 2);
  quad.color[3].m_data._0_8_ = *(undefined8 *)local_340->m_data;
  quad.color[3].m_data._8_8_ = *(undefined8 *)(local_340->m_data + 2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&quad);
  context = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_250,&renderedImg);
  glu::readPixels(context,iVar4,iVar5,(PixelBufferAccess *)local_250);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,0x185);
  de::toString<int>((string *)&errorMask,&this->m_iteration);
  std::operator+(&local_300,"Quad",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errorMask);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,local_300._M_dataplus._M_p,&local_349);
  de::toString<int>(&local_280,&this->m_iteration);
  std::operator+(&local_2c0,"Quad ",&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,local_2c0._M_dataplus._M_p,&local_34a);
  pSVar7 = &renderedImg;
  tcu::LogImage::LogImage
            ((LogImage *)local_250,&local_2e0,&local_2a0,pSVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_250,local_348.order,__buf,(size_t)pSVar7);
  tcu::LogImage::~LogImage((LogImage *)local_250);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&errorMask);
  tcu::Surface::Surface(&errorMask,iVar9,iVar12);
  bVar14 = true;
  poVar1 = (ostringstream *)(local_250 + 8);
  for (iVar9 = 0; iVar9 < renderedImg.m_height; iVar9 = iVar9 + 1) {
    for (iVar4 = 0; iVar4 < renderedImg.m_width; iVar4 = iVar4 + 1) {
      local_250._0_4_ =
           *(ChannelOrder *)
            ((long)renderedImg.m_pixels.m_ptr + (long)(renderedImg.m_width * iVar9 + iVar4) * 4);
      bVar2 = checkColor(this,local_340,(RGBA *)local_250,bVar14);
      lVar8 = (long)(errorMask.m_width * iVar9 + iVar4);
      if (bVar2) {
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + lVar8 * 4) = 0xff00ff00;
      }
      else {
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + lVar8 * 4) = 0xff0000ff;
        if (bVar14 != false) {
          local_250._0_4_ = local_348.order;
          local_250._4_4_ = local_348.type;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"First failure at pixel (");
          std::ostream::operator<<(poVar1,iVar4);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,iVar9);
          std::operator<<((ostream *)poVar1,") (not printing further errors)");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_250,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          bVar14 = false;
        }
      }
    }
  }
  if (bVar14 == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ColorChoiceErrorMask",(allocator<char> *)&local_2a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"Error mask for color choices",(allocator<char> *)&local_2c0);
    pSVar7 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)local_250,&local_2e0,&local_300,pSVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_250,local_348.order,__buf_00,(size_t)pSVar7);
    tcu::LogImage::~LogImage((LogImage *)local_250);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
    tcu::Surface::~Surface(&errorMask);
LAB_00edd1e6:
    bVar14 = false;
  }
  else {
    tcu::Surface::~Surface(&errorMask);
    bVar14 = true;
    if (this->m_ditheringEnabled == false) {
      c.m_value = *renderedImg.m_pixels.m_ptr;
      iVar9 = 0;
      uVar11 = 0;
      if (0 < renderedImg.m_width) {
        uVar11 = (ulong)(uint)renderedImg.m_width;
      }
      if (renderedImg.m_height < 1) {
        renderedImg.m_height = 0;
      }
      for (iVar4 = 0; iVar4 != renderedImg.m_height; iVar4 = iVar4 + 1) {
        iVar5 = 1;
        uVar13 = uVar11;
        iVar12 = iVar9;
        while (bVar2 = uVar13 != 0, uVar13 = uVar13 - 1, bVar2) {
          c_00.m_value = *(deUint32 *)((long)renderedImg.m_pixels.m_ptr + (long)iVar12 * 4);
          iVar5 = iVar5 + -1;
          iVar12 = iVar12 + 1;
          if (c_00.m_value != c.m_value) {
            poVar1 = (ostringstream *)(local_250 + 8);
            local_250._0_4_ = local_348.order;
            local_250._4_4_ = local_348.type;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"Failure: color at (");
            std::ostream::operator<<(poVar1,-iVar5);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,iVar4);
            std::operator<<((ostream *)poVar1,") is ");
            tcu::operator<<((ostream *)poVar1,c_00);
            std::operator<<((ostream *)poVar1," and does not equal the color at (0, 0), which is ");
            tcu::operator<<((ostream *)poVar1,c);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_250,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            goto LAB_00edd1e6;
          }
        }
        iVar9 = iVar9 + renderedImg.m_width;
      }
    }
  }
  tcu::Surface::~Surface(&renderedImg);
  return bVar14;
}

Assistant:

bool DitheringCase::drawAndCheckUnicoloredQuad (const Vec4& quadColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 32;
	const int					maxViewportHei		= 32;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing an unicolored quad with color " << quadColor << TestLog::EndMessage;

	quad.color[0] = quadColor;
	quad.color[1] = quadColor;
	quad.color[2] = quadColor;
	quad.color[3] = quadColor;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(("Quad" + de::toString(m_iteration)).c_str(), ("Quad " + de::toString(m_iteration)).c_str(), renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				if (!checkColor(quadColor, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the entire rendered image must be unicolored.

	if (!m_ditheringEnabled)
	{
		const tcu::RGBA renderedClr00 = renderedImg.getPixel(0, 0);

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const tcu::RGBA curClr = renderedImg.getPixel(x, y);

				if (curClr != renderedClr00)
				{
					log << TestLog::Message
						<< "Failure: color at (" << x << ", " << y << ") is " << curClr
						<< " and does not equal the color at (0, 0), which is " << renderedClr00
						<< TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}